

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

int notify_two_fds(int epfd,epoll_event *events,int maxevents,int timeout)

{
  int iVar1;
  
  iVar1 = -1;
  if (epoll_wait_fake.call_count == 1) {
    events->events = 4;
    (events->data).ptr = event_list[0];
    events[1].events = 1;
    events[1].data.ptr = event_list[1];
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int notify_two_fds(int epfd, struct epoll_event *events,
                          int maxevents, int timeout)
{
	(void)epfd;
	(void)maxevents;
	(void)timeout;

	if (epoll_wait_fake.call_count == 1) {
		events[0].events = EPOLLOUT;
		events[0].data.ptr = event_list[0];
		events[1].events = EPOLLIN;
		events[1].data.ptr = event_list[1];
		return 2;
	} else {
		return -1;
	}
}